

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void TableSettingsHandler_ReadLine
               (ImGuiContext *param_1,ImGuiSettingsHandler *param_2,void *entry,char *line)

{
  byte bVar1;
  int iVar2;
  ImGuiTableColumnSettings *pIVar3;
  long in_RCX;
  ImGuiTableSettings *in_RDX;
  ImGuiTableColumnSettings *column;
  char c;
  int n;
  int r;
  int column_n;
  float f;
  ImGuiTableSettings *settings;
  char local_39;
  ImGuiID local_38;
  int local_34;
  int local_30;
  float local_2c;
  ImGuiTableSettings *local_28;
  char *local_20;
  
  local_2c = 0.0;
  local_30 = 0;
  local_34 = 0;
  local_38 = 0;
  local_28 = in_RDX;
  local_20 = (char *)in_RCX;
  iVar2 = __isoc99_sscanf(in_RCX,"RefScale=%f",&local_2c);
  if (iVar2 == 1) {
    local_28->RefScale = local_2c;
  }
  else {
    iVar2 = __isoc99_sscanf(local_20,"Column %d%n",&local_30,&local_34);
    if (((iVar2 == 1) && (-1 < local_30)) && (local_30 < local_28->ColumnsCount)) {
      local_20 = ImStrSkipBlank((char *)((long)local_20 + (long)local_34));
      local_39 = '\0';
      pIVar3 = ImGuiTableSettings::GetColumnSettings(local_28);
      pIVar3 = pIVar3 + local_30;
      pIVar3->Index = (ImGuiTableColumnIdx)local_30;
      iVar2 = __isoc99_sscanf(local_20,"UserID=0x%08X%n",&local_38,&local_34);
      if (iVar2 == 1) {
        local_20 = ImStrSkipBlank(local_20 + local_34);
        pIVar3->UserID = local_38;
      }
      iVar2 = __isoc99_sscanf(local_20,"Width=%d%n",&local_38,&local_34);
      if (iVar2 == 1) {
        local_20 = ImStrSkipBlank(local_20 + local_34);
        pIVar3->WidthOrWeight = (float)(int)local_38;
        pIVar3->field_0xb = pIVar3->field_0xb & 0xf7;
        local_28->SaveFlags = local_28->SaveFlags | 1;
      }
      iVar2 = __isoc99_sscanf(local_20,"Weight=%f%n",&local_2c,&local_34);
      if (iVar2 == 1) {
        local_20 = ImStrSkipBlank(local_20 + local_34);
        pIVar3->WidthOrWeight = local_2c;
        pIVar3->field_0xb = pIVar3->field_0xb & 0xf7 | 8;
        local_28->SaveFlags = local_28->SaveFlags | 1;
      }
      iVar2 = __isoc99_sscanf(local_20,"Visible=%d%n",&local_38,&local_34);
      if (iVar2 == 1) {
        local_20 = ImStrSkipBlank(local_20 + local_34);
        pIVar3->field_0xb = pIVar3->field_0xb & 0xfb | ((byte)local_38 & 1) << 2;
        local_28->SaveFlags = local_28->SaveFlags | 4;
      }
      iVar2 = __isoc99_sscanf(local_20,"Order=%d%n",&local_38,&local_34);
      if (iVar2 == 1) {
        local_20 = ImStrSkipBlank(local_20 + local_34);
        pIVar3->DisplayOrder = (ImGuiTableColumnIdx)local_38;
        local_28->SaveFlags = local_28->SaveFlags | 2;
      }
      iVar2 = __isoc99_sscanf(local_20,"Sort=%d%c%n",&local_38,&local_39,&local_34);
      if (iVar2 == 2) {
        ImStrSkipBlank(local_20 + local_34);
        pIVar3->SortOrder = (ImGuiTableColumnIdx)local_38;
        bVar1 = 1;
        if (local_39 == '^') {
          bVar1 = 2;
        }
        pIVar3->field_0xb = pIVar3->field_0xb & 0xfc | bVar1;
        local_28->SaveFlags = local_28->SaveFlags | 8;
      }
    }
  }
  return;
}

Assistant:

static void TableSettingsHandler_ReadLine(ImGuiContext*, ImGuiSettingsHandler*, void* entry, const char* line)
{
    // "Column 0  UserID=0x42AD2D21 Width=100 Visible=1 Order=0 Sort=0v"
    ImGuiTableSettings* settings = (ImGuiTableSettings*)entry;
    float f = 0.0f;
    int column_n = 0, r = 0, n = 0;

    if (sscanf(line, "RefScale=%f", &f) == 1) { settings->RefScale = f; return; }

    if (sscanf(line, "Column %d%n", &column_n, &r) == 1)
    {
        if (column_n < 0 || column_n >= settings->ColumnsCount)
            return;
        line = ImStrSkipBlank(line + r);
        char c = 0;
        ImGuiTableColumnSettings* column = settings->GetColumnSettings() + column_n;
        column->Index = (ImGuiTableColumnIdx)column_n;
        if (sscanf(line, "UserID=0x%08X%n", (ImU32*)&n, &r)==1) { line = ImStrSkipBlank(line + r); column->UserID = (ImGuiID)n; }
        if (sscanf(line, "Width=%d%n", &n, &r) == 1)            { line = ImStrSkipBlank(line + r); column->WidthOrWeight = (float)n; column->IsStretch = 0; settings->SaveFlags |= ImGuiTableFlags_Resizable; }
        if (sscanf(line, "Weight=%f%n", &f, &r) == 1)           { line = ImStrSkipBlank(line + r); column->WidthOrWeight = f; column->IsStretch = 1; settings->SaveFlags |= ImGuiTableFlags_Resizable; }
        if (sscanf(line, "Visible=%d%n", &n, &r) == 1)          { line = ImStrSkipBlank(line + r); column->IsEnabled = (ImU8)n; settings->SaveFlags |= ImGuiTableFlags_Hideable; }
        if (sscanf(line, "Order=%d%n", &n, &r) == 1)            { line = ImStrSkipBlank(line + r); column->DisplayOrder = (ImGuiTableColumnIdx)n; settings->SaveFlags |= ImGuiTableFlags_Reorderable; }
        if (sscanf(line, "Sort=%d%c%n", &n, &c, &r) == 2)       { line = ImStrSkipBlank(line + r); column->SortOrder = (ImGuiTableColumnIdx)n; column->SortDirection = (c == '^') ? ImGuiSortDirection_Descending : ImGuiSortDirection_Ascending; settings->SaveFlags |= ImGuiTableFlags_Sortable; }
    }
}